

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result,
          FlatAllocator *alloc)

{
  FlatAllocator *descriptor;
  Descriptor *pDVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  this_00;
  DescriptorStringView psVar5;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  FlatAllocator *local_30;
  FlatAllocator *alloc_local;
  ExtensionRange *result_local;
  Descriptor *parent_local;
  ExtensionRange *proto_local;
  DescriptorBuilder *this_local;
  
  local_30 = alloc;
  alloc_local = (FlatAllocator *)result;
  result_local = (ExtensionRange *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (ExtensionRange *)this;
  iVar2 = DescriptorProto_ExtensionRange::start(proto);
  *(int32_t *)
   &(alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).pointers_.payload_.super_Base<char>.value = iVar2;
  iVar2 = DescriptorProto_ExtensionRange::end((DescriptorProto_ExtensionRange *)parent_local);
  *(int32_t *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 4) = iVar2;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)result_local;
  iVar3 = Descriptor::ExtensionRange::start_number((ExtensionRange *)alloc_local);
  if (iVar3 < 1) {
    this_00 = absl::lts_20240722::container_internal::
              raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
              ::
              operator[]<google::protobuf::Descriptor_const*,absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                        ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          *)&this->message_hints_,
                         (key_arg<const_google::protobuf::Descriptor_*> *)&result_local);
    pDVar1 = parent_local;
    iVar3 = Descriptor::ExtensionRange::start_number((ExtensionRange *)alloc_local);
    iVar4 = Descriptor::ExtensionRange::end_number((ExtensionRange *)alloc_local);
    MessageHints::RequestHintOnFieldNumbers(this_00,(Message *)pDVar1,NUMBER,iVar3,iVar4);
    psVar5 = Descriptor::full_name_abi_cxx11_((Descriptor *)result_local);
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    AddError(this,local_40,(Message *)parent_local,NUMBER,
             "Extension numbers must be positive integers.");
  }
  iVar3 = Descriptor::ExtensionRange::start_number((ExtensionRange *)alloc_local);
  iVar4 = Descriptor::ExtensionRange::end_number((ExtensionRange *)alloc_local);
  if (iVar4 <= iVar3) {
    psVar5 = Descriptor::full_name_abi_cxx11_((Descriptor *)result_local);
    local_50 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    AddError(this,local_50,(Message *)parent_local,NUMBER,
             "Extension range end number must be greater than start number.");
  }
  pDVar1 = parent_local;
  descriptor = alloc_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"google.protobuf.ExtensionRangeOptions");
  AllocateOptions<google::protobuf::Descriptor::ExtensionRange>
            (this,(Proto *)pDVar1,(ExtensionRange *)descriptor,3,local_60,local_30);
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto, const Descriptor* parent,
    Descriptor::ExtensionRange* result, internal::FlatAllocator& alloc) {
  result->start_ = proto.start();
  result->end_ = proto.end();
  result->containing_type_ = parent;

  if (result->start_number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER, result->start_number(),
        result->end_number());
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start_number() >= result->end_number()) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }

  // Copy options
  AllocateOptions(proto, result,
                  DescriptorProto_ExtensionRange::kOptionsFieldNumber,
                  "google.protobuf.ExtensionRangeOptions", alloc);
}